

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testDwaLookups.cpp
# Opt level: O0

int cpuCount(void)

{
  ulong uVar1;
  int cpuCount;
  undefined4 local_4;
  
  uVar1 = IlmThread_2_5::supportsThreads();
  if ((uVar1 & 1) == 0) {
    local_4 = 1;
  }
  else {
    local_4 = std::thread::hardware_concurrency();
    if (local_4 < 1) {
      local_4 = 1;
    }
  }
  return local_4;
}

Assistant:

int
cpuCount()
{
    if (!ILMTHREAD_NAMESPACE::supportsThreads()) return 1;

    int cpuCount = 1;

#if __cplusplus >= 201103L
    cpuCount = std::thread::hardware_concurrency();
#else

#if defined (OPENEXR_IMF_HAVE_SYSCONF_NPROCESSORS_ONLN)

    cpuCount = sysconf(_SC_NPROCESSORS_ONLN);

#elif defined (_WIN32)

    SYSTEM_INFO sysinfo;
    GetSystemInfo( &sysinfo );
    cpuCount = sysinfo.dwNumberOfProcessors;

#endif

#endif
    if (cpuCount < 1) cpuCount = 1;
    return cpuCount;
}